

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void * Acb_VerilogSimpleParse(Vec_Int_t *vBuffer,Abc_Nam_t *pNames)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  long lVar5;
  Vec_Int_t *__ptr;
  int *piVar6;
  Vec_Int_t *pInputs;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *p;
  Vec_Int_t *__ptr_01;
  int *pDesign;
  undefined1 *puVar7;
  undefined4 *puVar8;
  void *pvVar9;
  char *pcVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  Vec_Int_t *pVVar14;
  int iVar15;
  long lVar16;
  int Output;
  int in_stack_ffffffffffffff98;
  int local_64;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  piVar6 = (int *)malloc(400);
  __ptr->pArray = piVar6;
  pInputs = (Vec_Int_t *)malloc(0x10);
  pInputs->nCap = 100;
  pInputs->nSize = 0;
  piVar6 = (int *)malloc(400);
  pInputs->pArray = piVar6;
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nCap = 100;
  __ptr_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  __ptr_00->pArray = piVar6;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  __ptr_01 = (Vec_Int_t *)malloc(0x10);
  __ptr_01->nCap = 100;
  __ptr_01->nSize = 0;
  piVar6 = (int *)malloc(400);
  __ptr_01->pArray = piVar6;
  iVar11 = local_64;
  if (0 < vBuffer->nSize) {
    if (*vBuffer->pArray != 1) {
      __assert_fail("Vec_IntEntry(vBuffer, 0) == ACB_MODULE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0xeb,"void *Acb_VerilogSimpleParse(Vec_Int_t *, Abc_Nam_t *)");
    }
    if (2 < vBuffer->nSize) {
      lVar16 = 2;
      pVVar12 = (Vec_Int_t *)0x0;
      do {
        iVar11 = vBuffer->pArray[lVar16];
        local_64 = iVar11;
        if ((pVVar12 == (Vec_Int_t *)0x0) && (0xd < iVar11)) {
          pVVar14 = (Vec_Int_t *)0x0;
        }
        else {
          pVVar14 = __ptr;
          switch(iVar11) {
          case 2:
            goto switchD_00390102_caseD_2;
          case 3:
            break;
          case 4:
            pVVar14 = pInputs;
            break;
          case 5:
            pVVar14 = __ptr_00;
            break;
          default:
            pVVar14 = pVVar12;
            if (iVar11 - 6U < 8) {
              Vec_IntPush(p,iVar11);
              iVar11 = __ptr_01->nSize;
              pVVar12 = p;
              pVVar14 = __ptr_01;
            }
            Vec_IntPush(pVVar12,iVar11);
          }
        }
        lVar16 = lVar16 + 1;
        pVVar12 = pVVar14;
      } while (lVar16 < vBuffer->nSize);
    }
switchD_00390102_caseD_2:
    Vec_IntPush(p,-1);
    Vec_IntPush(p,__ptr_01->nSize);
    iVar11 = local_64;
    if (1 < vBuffer->nSize) {
      piVar6 = vBuffer->pArray;
      iVar11 = piVar6[1];
      pDesign = (int *)malloc(0x18);
      pDesign[0] = 0;
      pDesign[1] = 0x10;
      puVar7 = (undefined1 *)malloc(0x10);
      *(undefined1 **)(pDesign + 2) = puVar7;
      puVar8 = (undefined4 *)malloc(0x100);
      *(undefined4 **)(pDesign + 4) = puVar8;
      *puVar7 = 1;
      *pDesign = 1;
      *puVar8 = 0;
      puVar7[1] = 7;
      *pDesign = 2;
      puVar8[1] = iVar11;
      *puVar8 = 2;
      if (iVar11 == 0) {
        __assert_fail("Name",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                      ,0x20d,"void *Ndr_Create(int)");
      }
      iVar11 = piVar6[1];
      *(undefined1 *)(*(long *)(pDesign + 2) + 2) = 2;
      iVar15 = *pDesign;
      *pDesign = iVar15 + 1;
      *(undefined4 *)(*(long *)(pDesign + 4) + (long)iVar15 * 4) = 0;
      *(undefined1 *)(*(long *)(pDesign + 2) + 1 + (long)iVar15) = 7;
      piVar6 = *(int **)(pDesign + 4);
      iVar15 = *pDesign;
      *pDesign = iVar15 + 1;
      piVar6[iVar15] = iVar11;
      pbVar4 = *(byte **)(pDesign + 2);
      if (pbVar4[2] == 0) {
LAB_00390795:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      if (pbVar4[2] < 4) {
        piVar6[2] = piVar6[2] + iVar15 + -1;
        if (*pbVar4 == 0) goto LAB_00390795;
        if (*pbVar4 < 4) {
          iVar11 = *pDesign + -2 + *piVar6;
          *piVar6 = iVar11;
          if (iVar11 != *pDesign) {
            __assert_fail("(int)p->pBody[0] == p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                          ,0x21c,"int Ndr_AddModule(void *, int)");
          }
          iVar11 = *pDesign + __ptr->nSize;
          if (pDesign[1] < iVar11) {
            iVar15 = pDesign[1] * 2;
            if (iVar15 <= iVar11) {
              iVar15 = iVar11;
            }
            pDesign[1] = iVar15;
            pvVar9 = realloc(pbVar4,(long)iVar15);
            *(void **)(pDesign + 2) = pvVar9;
            pvVar9 = realloc(*(void **)(pDesign + 4),(long)(iVar15 << 2));
            *(void **)(pDesign + 4) = pvVar9;
          }
          iVar11 = __ptr->nSize;
          if (0 < iVar11) {
            iVar15 = *pDesign;
            lVar16 = *(long *)(pDesign + 2);
            lVar5 = *(long *)(pDesign + 4);
            lVar13 = 0;
            do {
              local_64 = __ptr->pArray[lVar13];
              *(undefined1 *)(lVar16 + iVar15 + lVar13) = 4;
              *(int *)((long)iVar15 * 4 + lVar5 + lVar13 * 4) = local_64;
              lVar13 = lVar13 + 1;
              iVar11 = __ptr->nSize;
            } while (lVar13 < iVar11);
            *pDesign = iVar15 + (int)lVar13;
          }
          pbVar4 = *(byte **)(pDesign + 2);
          if (pbVar4[2] == 0) goto LAB_00390795;
          if (pbVar4[2] < 4) {
            piVar6 = *(int **)(pDesign + 4);
            piVar6[2] = piVar6[2] + iVar11;
            if (*pbVar4 == 0) goto LAB_00390795;
            if (*pbVar4 < 4) {
              *piVar6 = *piVar6 + __ptr->nSize;
              iVar11 = *pDesign + pInputs->nSize;
              if (pDesign[1] < iVar11) {
                iVar15 = pDesign[1] * 2;
                if (iVar15 <= iVar11) {
                  iVar15 = iVar11;
                }
                pDesign[1] = iVar15;
                pvVar9 = realloc(pbVar4,(long)iVar15);
                *(void **)(pDesign + 2) = pvVar9;
                pvVar9 = realloc(piVar6,(long)(iVar15 << 2));
                *(void **)(pDesign + 4) = pvVar9;
              }
              iVar11 = pInputs->nSize;
              if (0 < iVar11) {
                iVar15 = *pDesign;
                lVar16 = *(long *)(pDesign + 2);
                lVar5 = *(long *)(pDesign + 4);
                lVar13 = 0;
                do {
                  local_64 = pInputs->pArray[lVar13];
                  *(undefined1 *)(lVar16 + iVar15 + lVar13) = 5;
                  *(int *)((long)iVar15 * 4 + lVar5 + lVar13 * 4) = local_64;
                  lVar13 = lVar13 + 1;
                  iVar11 = pInputs->nSize;
                } while (lVar13 < iVar11);
                *pDesign = iVar15 + (int)lVar13;
              }
              pbVar4 = *(byte **)(pDesign + 2);
              if (pbVar4[2] == 0) goto LAB_00390795;
              if (pbVar4[2] < 4) {
                piVar6 = *(int **)(pDesign + 4);
                piVar6[2] = piVar6[2] + iVar11;
                if (*pbVar4 == 0) goto LAB_00390795;
                if (*pbVar4 < 4) {
                  *piVar6 = *piVar6 + pInputs->nSize;
                  iVar11 = *pDesign + __ptr_00->nSize;
                  if (pDesign[1] < iVar11) {
                    iVar15 = pDesign[1] * 2;
                    if (iVar15 <= iVar11) {
                      iVar15 = iVar11;
                    }
                    pDesign[1] = iVar15;
                    pvVar9 = realloc(pbVar4,(long)iVar15);
                    *(void **)(pDesign + 2) = pvVar9;
                    pvVar9 = realloc(piVar6,(long)(iVar15 << 2));
                    *(void **)(pDesign + 4) = pvVar9;
                  }
                  if (__ptr_00->nSize < 1) {
                    iVar15 = 0;
                    iVar11 = local_64;
                  }
                  else {
                    lVar16 = 0;
                    iVar15 = 0;
                    do {
                      iVar11 = __ptr_00->pArray[lVar16];
                      pcVar10 = Abc_NamStr(pNames,iVar11);
                      if ((*pcVar10 == 't') && (pcVar10[1] == '_')) {
                        iVar2 = *pDesign;
                        *(undefined1 *)(*(long *)(pDesign + 2) + (long)iVar2) = 10;
                        *pDesign = iVar2 + 1;
                        *(int *)(*(long *)(pDesign + 4) + (long)iVar2 * 4) = iVar11;
                        iVar15 = iVar15 + 1;
                      }
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < __ptr_00->nSize);
                  }
                  pbVar4 = *(byte **)(pDesign + 2);
                  bVar1 = pbVar4[2];
                  local_64 = iVar11;
                  if (bVar1 == 0) goto LAB_00390795;
                  if (bVar1 < 4) {
                    piVar6 = *(int **)(pDesign + 4);
                    piVar6[2] = piVar6[2] + iVar15;
                    bVar1 = *pbVar4;
                    if (bVar1 == 0) goto LAB_00390795;
                    if (bVar1 < 4) {
                      *piVar6 = *piVar6 + iVar15;
                      if (0 < __ptr->nSize) {
                        lVar16 = 0;
                        do {
                          local_64 = __ptr->pArray[lVar16];
                          Ndr_AddObject(pDesign,0x102,3,0,0,(int)&local_64,in_stack_ffffffffffffff98
                                        ,(int)__ptr_00,&pInputs->nCap,(int)__ptr_01,&pNames->nStore,
                                        (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                         in_stack_ffffffffffffffc0));
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < __ptr->nSize);
                      }
                      local_64 = Abc_NamStrFind(pNames,"1\'b0");
                      if (local_64 != 0) {
                        Ndr_AddObject(pDesign,0x102,7,0,0,(int)&local_64,in_stack_ffffffffffffff98,
                                      (int)__ptr_00,&pInputs->nCap,(int)__ptr_01,&pNames->nStore,
                                      (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                       in_stack_ffffffffffffffc0));
                      }
                      local_64 = Abc_NamStrFind(pNames,"1\'b1");
                      if (local_64 != 0) {
                        Ndr_AddObject(pDesign,0x102,8,0,0,(int)&local_64,in_stack_ffffffffffffff98,
                                      (int)__ptr_00,&pInputs->nCap,(int)__ptr_01,&pNames->nStore,
                                      (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                       in_stack_ffffffffffffffc0));
                      }
                      iVar15 = p->nSize;
                      iVar11 = local_64;
                      if (1 < iVar15) {
                        piVar6 = p->pArray;
                        lVar16 = 0;
                        do {
                          iVar11 = piVar6[lVar16];
                          iVar2 = (int)lVar16;
                          if (0 < iVar11) {
                            uVar3 = piVar6[lVar16 + 1];
                            if (((int)uVar3 < 0) || (__ptr_01->nSize <= (int)uVar3))
                            goto LAB_0039072e;
                            in_stack_ffffffffffffffc4 = __ptr_01->pArray[uVar3];
                            if (iVar15 <= iVar2 + 3) goto LAB_0039072e;
                            if (__ptr_01->nSize <= (int)(uVar3 + 1)) {
                              local_64 = iVar11;
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                            }
                            if (7 < iVar11 - 6U) {
                              local_64 = iVar11;
                              __assert_fail("0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                                            ,0x56,"int Acb_Type2Oper(int)");
                            }
                            Ndr_AddObject(pDesign,0x102,iVar11 + 5,~uVar3 + piVar6[lVar16 + 3],
                                          (int)__ptr_01->pArray + (uVar3 + 1) * 4,
                                          (int)&stack0xffffffffffffffc4,in_stack_ffffffffffffff98,
                                          (int)__ptr_00,&pInputs->nCap,(int)__ptr_01,&pNames->nStore
                                          ,(char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0));
                          }
                          lVar16 = lVar16 + 2;
                        } while (iVar2 + 3 < iVar15);
                      }
                      local_64 = iVar11;
                      if (0 < pInputs->nSize) {
                        lVar16 = 0;
                        pVVar12 = pInputs;
                        do {
                          local_64 = pInputs->pArray[lVar16];
                          Ndr_AddObject(pDesign,0x102,4,1,(int)&local_64,(int)&local_64,
                                        in_stack_ffffffffffffff98,(int)__ptr_00,&pVVar12->nCap,
                                        (int)__ptr_01,&pNames->nStore,
                                        (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                         in_stack_ffffffffffffffc0));
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < pInputs->nSize);
                      }
                      if (__ptr->pArray != (int *)0x0) {
                        free(__ptr->pArray);
                        __ptr->pArray = (int *)0x0;
                      }
                      free(__ptr);
                      if (pInputs->pArray != (int *)0x0) {
                        free(pInputs->pArray);
                        pInputs->pArray = (int *)0x0;
                      }
                      free(pInputs);
                      if (__ptr_00->pArray != (int *)0x0) {
                        free(__ptr_00->pArray);
                        __ptr_00->pArray = (int *)0x0;
                      }
                      free(__ptr_00);
                      if (p->pArray != (int *)0x0) {
                        free(p->pArray);
                        p->pArray = (int *)0x0;
                      }
                      free(p);
                      if (__ptr_01->pArray != (int *)0x0) {
                        free(__ptr_01->pArray);
                        __ptr_01->pArray = (int *)0x0;
                      }
                      free(__ptr_01);
                      return pDesign;
                    }
                  }
                }
              }
            }
          }
        }
      }
      __assert_fail("Ndr_DataType(p, i) <= NDR_OBJECT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                    ,0x83,"void Ndr_DataAddTo(Ndr_Data_t *, int, int)");
    }
  }
LAB_0039072e:
  local_64 = iVar11;
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void * Acb_VerilogSimpleParse( Vec_Int_t * vBuffer, Abc_Nam_t * pNames )
{
    Ndr_Data_t * pDesign = NULL;
    Vec_Int_t * vInputs  = Vec_IntAlloc(100);
    Vec_Int_t * vOutputs = Vec_IntAlloc(100);
    Vec_Int_t * vWires   = Vec_IntAlloc(100);
    Vec_Int_t * vTypes   = Vec_IntAlloc(100);
    Vec_Int_t * vFanins  = Vec_IntAlloc(100);
    Vec_Int_t * vCur     = NULL;  
    int i, ModuleID, Token, Size, Count = 0;
    assert( Vec_IntEntry(vBuffer, 0) == ACB_MODULE );
    Vec_IntForEachEntryStart( vBuffer, Token, i, 2 )
    {
        if ( vCur == NULL && Token >= ACB_UNUSED )
            continue;
        if ( Token == ACB_ENDMODULE )
            break;
        if ( Token == ACB_INPUT )
            vCur = vInputs;
        else if ( Token == ACB_OUTPUT )
            vCur = vOutputs;
        else if ( Token == ACB_WIRE )
            vCur = vWires;
        else if ( Token >= ACB_BUF && Token <= ACB_XNOR )
        {
            //char * pToken = Abc_NamStr(pNames, Vec_IntEntry(vBuffer, i+1));
            Vec_IntPush( vTypes, Token );
            Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
            vCur = vFanins;
            //if ( pToken[1] == 'z' && pToken[2] == '_' && pToken[3] == 'g' && pToken[4] == '_' )
            //    i++;
        }
        else 
            Vec_IntPush( vCur, Token );
    }
    Vec_IntPush( vTypes, -1 );
    Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
    // create design
    pDesign = (Ndr_Data_t *)Ndr_Create( Vec_IntEntry(vBuffer, 1) );
    ModuleID = Ndr_AddModule( pDesign, Vec_IntEntry(vBuffer, 1) );
    // create inputs
    Ndr_DataResize( pDesign, Vec_IntSize(vInputs) );
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_DataPush( pDesign, NDR_INPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vInputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vInputs) );
    // create outputs
    Ndr_DataResize( pDesign, Vec_IntSize(vOutputs) );
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_DataPush( pDesign, NDR_OUTPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vOutputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vOutputs) );
    // create targets
    Ndr_DataResize( pDesign, Vec_IntSize(vWires) );
    Vec_IntForEachEntry( vWires, Token, i )
        if ( Acb_WireIsTarget(Token, pNames) )
            Ndr_DataPush( pDesign, NDR_TARGET, Token ), Count++;
    Ndr_DataAddTo( pDesign, ModuleID-256, Count );
    Ndr_DataAddTo( pDesign, 0, Count );
    // create nodes
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CI, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b0")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_F, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b1")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_T, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    Vec_IntForEachEntryDouble( vTypes, Token, Size, i ) 
        if ( Token > 0 )
        {
            int Output = Vec_IntEntry(vFanins, Size);
            int nFanins = Vec_IntEntry(vTypes, i+3) - Size - 1;
            int * pFanins = Vec_IntEntryP(vFanins, Size+1);
            Ndr_AddObject( pDesign, ModuleID, Acb_Type2Oper(Token), 0, 0, 0, 0, nFanins, pFanins, 1, &Output, NULL ); // many fanins
        }
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CO, 0, 0, 0, 0,   1, &Token, 1, &Token,  NULL  ); // one fanin
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vWires );
    Vec_IntFree( vTypes );
    Vec_IntFree( vFanins );
    return pDesign;
}